

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O2

string * __thiscall
tinyusdz::to_string_abi_cxx11_(string *__return_storage_ptr__,tinyusdz *this,Projection *proj)

{
  allocator *paVar1;
  char *pcVar2;
  allocator local_a;
  allocator local_9;
  
  if (*(int *)this == 1) {
    pcVar2 = "orthographic";
    paVar1 = &local_9;
  }
  else {
    pcVar2 = "perspective";
    paVar1 = &local_a;
  }
  ::std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar2,paVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(const GeomCamera::Projection &proj) {
  if (proj == GeomCamera::Projection::Orthographic) {
    return "orthographic";
  } else {
    return "perspective";
  }
}